

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  ImDrawList *pIVar1;
  ImU32 IVar2;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImGuiWindow *local_30;
  ImGuiWindow *window;
  byte local_1d;
  float rounding_local;
  bool border_local;
  ImVec2 IStack_18;
  ImU32 fill_col_local;
  ImVec2 p_max_local;
  ImVec2 p_min_local;
  
  window._4_4_ = rounding;
  local_1d = border;
  rounding_local = (float)fill_col;
  IStack_18 = p_max;
  p_max_local = p_min;
  local_30 = GetCurrentWindow();
  ImDrawList::AddRectFilled
            (local_30->DrawList,&p_max_local,&stack0xffffffffffffffe8,(ImU32)rounding_local,
             window._4_4_,0xf);
  if (((local_1d & 1) != 0) && ((local_30->Flags & 0x80U) != 0)) {
    pIVar1 = local_30->DrawList;
    ImVec2::ImVec2(&local_40,1.0,1.0);
    local_38 = ::operator+(&p_max_local,&local_40);
    ImVec2::ImVec2(&local_50,1.0,1.0);
    local_48 = ::operator+(&stack0xffffffffffffffe8,&local_50);
    IVar2 = GetColorU32(6,1.0);
    ImDrawList::AddRect(pIVar1,&local_38,&local_48,IVar2,window._4_4_,0xf,1.0);
    pIVar1 = local_30->DrawList;
    IVar2 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar1,&p_max_local,&stack0xffffffffffffffe8,IVar2,window._4_4_,0xf,1.0);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiWindow* window = GetCurrentWindow();

    window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    if (border && (window->Flags & ImGuiWindowFlags_ShowBorders))
    {
        window->DrawList->AddRect(p_min+ImVec2(1,1), p_max+ImVec2(1,1), GetColorU32(ImGuiCol_BorderShadow), rounding);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding);
    }
}